

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O2

int run_test_fs_poll_close_request_stop_when_active(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_fs_poll_t poll_handle;
  uv_loop_t loop;
  
  remove("testfile");
  iVar1 = uv_loop_init(&loop);
  eval_b = (int64_t)iVar1;
  poll_handle.data = (void *)eval_b;
  if ((void *)eval_b == (void *)0x0) {
    iVar1 = uv_fs_poll_init(&loop,&poll_handle);
    eval_b = (int64_t)iVar1;
    eval_b_1 = 0;
    if ((void *)eval_b == (void *)0x0) {
      iVar1 = uv_fs_poll_start(&poll_handle,poll_cb_noop,"testfile",100);
      eval_b = (int64_t)iVar1;
      eval_b_1 = 0;
      if ((void *)eval_b == (void *)0x0) {
        uv_run(&loop,UV_RUN_ONCE);
        iVar1 = uv_fs_poll_stop(&poll_handle);
        eval_b = (int64_t)iVar1;
        eval_b_1 = 0;
        if ((void *)eval_b == (void *)0x0) {
          uv_run(&loop,UV_RUN_ONCE);
          uv_close((uv_handle_t *)&poll_handle,close_cb);
          uv_run(&loop,UV_RUN_ONCE);
          eval_b = 1;
          eval_b_1 = (int64_t)close_cb_called;
          if (eval_b_1 == 1) {
            close_loop(&loop);
            eval_b = 0;
            iVar1 = uv_loop_close(&loop);
            eval_b_1 = (int64_t)iVar1;
            if (eval_b_1 == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar4 = "uv_loop_close(&loop)";
            pcVar3 = "0";
            uVar2 = 0x122;
          }
          else {
            pcVar4 = "close_cb_called";
            pcVar3 = "1";
            uVar2 = 0x120;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_fs_poll_stop(&poll_handle)";
          uVar2 = 0x11a;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "uv_fs_poll_start(&poll_handle, poll_cb_noop, \"testfile\", 100)";
        uVar2 = 0x116;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "uv_fs_poll_init(&loop, &poll_handle)";
      uVar2 = 0x115;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_loop_init(&loop)";
    uVar2 = 0x112;
    eval_b_1 = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_b,"==",eval_b_1);
  abort();
}

Assistant:

TEST_IMPL(fs_poll_close_request_stop_when_active) {
  /* Regression test for https://github.com/libuv/libuv/issues/2287. */
  uv_loop_t loop;
  uv_fs_poll_t poll_handle;

  remove(FIXTURE);

  ASSERT_OK(uv_loop_init(&loop));

  /* Set up all handles. */
  ASSERT_OK(uv_fs_poll_init(&loop, &poll_handle));
  ASSERT_OK(uv_fs_poll_start(&poll_handle, poll_cb_noop, FIXTURE, 100));
  uv_run(&loop, UV_RUN_ONCE);

  /* Close the timer handle, and do not crash. */
  ASSERT_OK(uv_fs_poll_stop(&poll_handle));
  uv_run(&loop, UV_RUN_ONCE);

  /* Clean up after the test. */
  uv_close((uv_handle_t*) &poll_handle, close_cb);
  uv_run(&loop, UV_RUN_ONCE);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}